

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg.c
# Opt level: O0

uint aom_avg_8x8_c(uint8_t *s,int p)

{
  int sum;
  int j;
  int i;
  int p_local;
  uint8_t *s_local;
  
  sum = 0;
  s_local = s;
  for (i = 0; i < 8; i = i + 1) {
    for (j = 0; j < 8; j = j + 1) {
      sum = (uint)s_local[j] + sum;
    }
    s_local = s_local + p;
  }
  return sum + 0x20 >> 6;
}

Assistant:

unsigned int aom_avg_8x8_c(const uint8_t *s, int p) {
  int i, j;
  int sum = 0;
  for (i = 0; i < 8; ++i, s += p)
    for (j = 0; j < 8; sum += s[j], ++j) {
    }

  return (sum + 32) >> 6;
}